

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c++
# Opt level: O1

Own<capnp::_::CapTableBuilder,_std::nullptr_t> __thiscall
capnp::MessageBuilder::releaseBuiltinCapTable(MessageBuilder *this)

{
  undefined8 *puVar1;
  CapTableBuilder *extraout_RDX;
  long in_RSI;
  Own<capnp::_::CapTableBuilder,_std::nullptr_t> OVar2;
  
  puVar1 = (undefined8 *)operator_new(0x28);
  *puVar1 = &PTR_extractCap_0021b168;
  puVar1[1] = *(undefined8 *)(in_RSI + 0x28);
  puVar1[2] = *(undefined8 *)(in_RSI + 0x30);
  puVar1[3] = *(undefined8 *)(in_RSI + 0x38);
  puVar1[4] = *(undefined8 *)(in_RSI + 0x40);
  *(undefined8 *)(in_RSI + 0x28) = 0;
  *(undefined8 *)(in_RSI + 0x30) = 0;
  *(undefined8 *)(in_RSI + 0x38) = 0;
  this->_vptr_MessageBuilder =
       (_func_int **)&kj::_::HeapDisposer<capnp::_::BuilderArena::LocalCapTable>::instance;
  this->arenaSpace[0] = puVar1;
  OVar2.ptr = extraout_RDX;
  OVar2.disposer = (Disposer *)this;
  return OVar2;
}

Assistant:

kj::Own<_::CapTableBuilder> MessageBuilder::releaseBuiltinCapTable() {
  return arena()->releaseLocalCapTable();
}